

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asap.h
# Opt level: O0

datetime * asap::tomorrow(void)

{
  datetime *in_RDI;
  datetime *n;
  duration<86400UL> local_10;
  
  now();
  duration<86400UL>::duration(&local_10,1.0);
  datetime::operator+=(in_RDI,&local_10);
  datetime::hour(in_RDI,0);
  datetime::minute(in_RDI,0);
  datetime::second(in_RDI,0);
  return in_RDI;
}

Assistant:

static inline asap::datetime tomorrow() {
    auto n = asap::now();
    n += asap::days(1);
    n.hour(0);
    n.minute(0);
    n.second(0);
    return n;
  }